

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmCallUserFunction
                (jx9_vm *pVm,jx9_value *pFunc,int nArg,jx9_value **apArg,jx9_value *pResult)

{
  jx9_value *pStack;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  VmInstr aInstr [2];
  jx9_value *aStack;
  jx9_value *pResult_local;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_value *pFunc_local;
  jx9_vm *pVm_local;
  
  if ((pFunc->iFlags & 1U) == 0) {
    if (pResult != (jx9_value *)0x0) {
      jx9MemObjRelease(pResult);
    }
    pVm_local._4_4_ = -9;
  }
  else {
    pStack = VmNewOperandStack(pVm,nArg + 1);
    if (pStack == (jx9_value *)0x0) {
      jx9VmThrowError(pVm,(SyString *)0x0,1,
                      "JX9 is running out of memory while invoking user callback");
      if (pResult != (jx9_value *)0x0) {
        jx9MemObjRelease(pResult);
      }
      pVm_local._4_4_ = -1;
    }
    else {
      for (local_7c = 0; local_7c < nArg; local_7c = local_7c + 1) {
        jx9MemObjLoad(apArg[local_7c],pStack + local_7c);
        pStack[local_7c].nIdx = apArg[local_7c]->nIdx;
      }
      jx9MemObjLoad(pFunc,pStack + local_7c);
      pStack[local_7c].nIdx = 0xffffffff;
      local_78[0] = '\x10';
      aInstr[0].iOp = '\0';
      aInstr[0]._1_3_ = 0;
      aInstr[0].iP2 = 0;
      aInstr[0]._12_4_ = 0;
      aInstr[0].p3._0_1_ = 1;
      aInstr[0].p3._4_4_ = 1;
      aInstr[1].iOp = '\0';
      aInstr[1]._1_3_ = 0;
      aInstr[1].iP2 = 0;
      aInstr[1]._12_4_ = 0;
      i = nArg;
      VmByteCodeExec(pVm,(VmInstr *)local_78,pStack,nArg,pResult);
      SyMemBackendFree(&pVm->sAllocator,pStack);
      pVm_local._4_4_ = 0;
    }
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmCallUserFunction(
	jx9_vm *pVm,       /* Target VM */
	jx9_value *pFunc,  /* Callback name */
	int nArg,          /* Total number of given arguments */
	jx9_value **apArg, /* Callback arguments */
	jx9_value *pResult /* Store callback return value here. NULL otherwise */
	)
{
	jx9_value *aStack;
	VmInstr aInstr[2];
	int i;
	if((pFunc->iFlags & (MEMOBJ_STRING)) == 0 ){
		/* Don't bother processing, it's invalid anyway */
		if( pResult ){
			/* Assume a null return value */
			jx9MemObjRelease(pResult);
		}
		return SXERR_INVALID;
	}
	/* Create a new operand stack */
	aStack = VmNewOperandStack(&(*pVm), 1+nArg);
	if( aStack == 0 ){
		jx9VmThrowError(&(*pVm), 0, JX9_CTX_ERR, 
			"JX9 is running out of memory while invoking user callback");
		if( pResult ){
			/* Assume a null return value */
			jx9MemObjRelease(pResult);
		}
		return SXERR_MEM;
	}
	/* Fill the operand stack with the given arguments */
	for( i = 0 ; i < nArg ; i++ ){
		jx9MemObjLoad(apArg[i], &aStack[i]);
		aStack[i].nIdx = apArg[i]->nIdx;
	}
	/* Push the function name */
	jx9MemObjLoad(pFunc, &aStack[i]);
	aStack[i].nIdx = SXU32_HIGH; /* Mark as constant */
	/* Emit the CALL istruction */
	aInstr[0].iOp = JX9_OP_CALL;
	aInstr[0].iP1 = nArg; /* Total number of given arguments */
	aInstr[0].iP2 = 0;
	aInstr[0].p3  = 0;
	/* Emit the DONE instruction */
	aInstr[1].iOp = JX9_OP_DONE;
	aInstr[1].iP1 = 1;   /* Extract function return value if available */
	aInstr[1].iP2 = 0;
	aInstr[1].p3  = 0;
	/* Execute the function body (if available) */
	VmByteCodeExec(&(*pVm), aInstr, aStack, nArg, pResult);
	/* Clean up the mess left behind */
	SyMemBackendFree(&pVm->sAllocator, aStack);
	return JX9_OK;
}